

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O3

void __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_>::insert
          (miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_> *this,
          spectral_operation *trans)

{
  uint16_t uVar1;
  pointer psVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar3 = (ulong)this->transform_index;
  psVar2 = (this->transforms).
           super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->transforms).
                super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 1;
  uVar5 = lVar4 * -0x5555555555555555;
  if (uVar5 < uVar3 || uVar5 - uVar3 == 0) {
    std::
    vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>::
    resize(&this->transforms,lVar4 * 0x5555555555555556);
    uVar3 = (ulong)this->transform_index;
    psVar2 = (this->transforms).
             super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  this->transform_index = (int)uVar3 + 1;
  psVar2[uVar3]._var2 = trans->_var2;
  uVar1 = trans->_var1;
  psVar2[uVar3]._kind = trans->_kind;
  psVar2[uVar3]._var1 = uVar1;
  return;
}

Assistant:

void insert( const spectral_operation& trans )
  {
    if ( transform_index >= transforms.size() )
    {
      transforms.resize( transforms.size() << 1 );
    }
    assert( transform_index < transforms.size() );
    transforms[transform_index++] = trans;
  }